

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

ImPlotPoint ValueGetter::getValue<float,unsigned_long>(void *data,int idx)

{
  undefined8 uVar1;
  ImPlotPoint IVar2;
  
  IVar2.x = (double)*(float *)(*(long *)((long)data + 8) + (long)idx * 4);
  uVar1 = *(undefined8 *)(*(long *)((long)data + 0x90) + (long)idx * 8);
  IVar2.y = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  return IVar2;
}

Assistant:

static ImPlotPoint getValue(void* data, int idx) {
    const auto* this_ = static_cast<ValueGetter*>(data);
    double x, y;
    if constexpr (std::is_void<X>::value) {
      x = static_cast<double>(idx);
    } else {
      x = static_cast<double>((static_cast<X*>(this_->infoX.ptr))[idx]);
    }
    y = static_cast<double>((static_cast<Y*>(this_->infoY.ptr))[idx]);
    return ImPlotPoint(x, y);
  }